

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

void prvTidyAdjustTags(TidyDocImpl *doc)

{
  TidyTagImpl *tags;
  Dict *pDVar1;
  
  pDVar1 = prvTidyLookupTagDef(TidyTag_A);
  tags = &doc->tags;
  if (pDVar1 != (Dict *)0x0) {
    pDVar1->parser = prvTidyParseInline;
    pDVar1->model = 0x10;
    tagsEmptyHash(doc,tags);
  }
  pDVar1 = prvTidyLookupTagDef(TidyTag_CAPTION);
  if (pDVar1 != (Dict *)0x0) {
    pDVar1->parser = prvTidyParseInline;
    tagsEmptyHash(doc,tags);
  }
  pDVar1 = prvTidyLookupTagDef(TidyTag_OBJECT);
  if (pDVar1 != (Dict *)0x0) {
    *(byte *)&pDVar1->model = (byte)pDVar1->model | 4;
    tagsEmptyHash(doc,tags);
    return;
  }
  return;
}

Assistant:

void TY_(AdjustTags)( TidyDocImpl *doc )
{
    Dict *np = (Dict *)TY_(LookupTagDef)( TidyTag_A );
    TidyTagImpl* tags = &doc->tags;
    if (np) 
    {
        np->parser = TY_(ParseInline);
        np->model  = CM_INLINE;
#if ELEMENT_HASH_LOOKUP
        tagsEmptyHash( doc, tags );
#endif
    }

/*\
 * Issue #196
 * TidyTag_CAPTION allows %flow; in HTML5,
 * but only %inline; in HTML4
\*/
    np = (Dict *)TY_(LookupTagDef)( TidyTag_CAPTION );
    if (np)
    {
        np->parser = TY_(ParseInline);
#if ELEMENT_HASH_LOOKUP
        tagsEmptyHash( doc, tags );
#endif
    }

/*\
 * Issue #232
 * TidyTag_OBJECT not in head in HTML5,
 * but still allowed in HTML4
\*/
    np = (Dict *)TY_(LookupTagDef)( TidyTag_OBJECT );
    if (np)
    {
        np->model |= CM_HEAD; /* add back allowed in head */
#if ELEMENT_HASH_LOOKUP
        tagsEmptyHash( doc, tags );
#endif
    }
}